

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

void luaX_next(LexState *ls)

{
  Token *pTVar1;
  SemInfo SVar2;
  undefined4 uVar3;
  int iVar4;
  
  iVar4 = (ls->lookahead).token;
  ls->lastline = ls->linenumber;
  if (iVar4 == 0x121) {
    iVar4 = llex(ls,&(ls->t).seminfo);
    (ls->t).token = iVar4;
  }
  else {
    pTVar1 = &ls->lookahead;
    uVar3 = *(undefined4 *)&pTVar1->field_0x4;
    SVar2 = (ls->lookahead).seminfo;
    (ls->t).token = pTVar1->token;
    *(undefined4 *)&(ls->t).field_0x4 = uVar3;
    (ls->t).seminfo = SVar2;
    pTVar1->token = 0x121;
  }
  return;
}

Assistant:

void luaX_next (LexState *ls) {
  ls->lastline = ls->linenumber;
  if (ls->lookahead.token != TK_EOS) {  /* is there a look-ahead token? */
    ls->t = ls->lookahead;  /* use this one */
    ls->lookahead.token = TK_EOS;  /* and discharge it */
  }
  else
    ls->t.token = llex(ls, &ls->t.seminfo);  /* read next token */
}